

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O2

void fl_initialize(int *argc,char **argv,char *param_3,void *param_4,int param_5)

{
  int iVar1;
  char **ppcVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int local_34;
  
  initargc = *argc;
  uVar6 = (ulong)initargc;
  uVar5 = 0xffffffffffffffff;
  if (-2 < (long)uVar6) {
    uVar5 = uVar6 * 8 + 8;
  }
  ppcVar2 = (char **)operator_new__(uVar5);
  initargv = ppcVar2;
  for (lVar3 = 0; lVar3 <= (long)uVar6; lVar3 = lVar3 + 1) {
    ppcVar2[lVar3] = argv[lVar3];
  }
  local_34 = 1;
  iVar4 = 1;
  while( true ) {
    if ((int)uVar6 <= local_34) break;
    iVar1 = Fl::arg((int)uVar6,argv,&local_34);
    if (iVar1 == 0) {
      lVar3 = (long)local_34;
      local_34 = local_34 + 1;
      argv[iVar4] = argv[lVar3];
      iVar4 = iVar4 + 1;
    }
    uVar6 = (ulong)(uint)*argc;
  }
  argv[iVar4] = (char *)0x0;
  *argc = iVar4;
  if (fl_flip == '\x02') {
    fl_flip = '\0';
  }
  return;
}

Assistant:

void fl_initialize(int *argc, char **argv, const char *, FL_CMD_OPT *, int) {
  initargc = *argc;
  initargv = new char*[*argc+1];
  int i,j;
  for (i=0; i<=*argc; i++) initargv[i] = argv[i];
  for (i=j=1; i<*argc; ) {
    if (Fl::arg(*argc,argv,i));
    else argv[j++] = argv[i++];
  }
  argv[j] = 0;
  *argc = j;
  if (fl_flip==2) fl_flip = 0;
}